

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O1

void avro::codec_traits<testgen::RootRecord>::encode(Encoder *e,RootRecord *v)

{
  ulong in_RAX;
  pointer puVar1;
  uint8_t b;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  (**(code **)(*(long *)e + 0x38))(e,v->mylong);
  (**(code **)(*(long *)e + 0x48))((v->nestedrecord).inval1,e);
  (**(code **)(*(long *)e + 0x50))(e,&(v->nestedrecord).inval2);
  (**(code **)(*(long *)e + 0x30))(e,(v->nestedrecord).inval3);
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::encode(e,&v->mymap);
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested>_>_>_>
  ::encode(e,&v->recordmap);
  codec_traits<std::vector<double,_std::allocator<double>_>_>::encode(e,&v->myarray);
  codec_traits<testgen::ExampleEnum>::encode(e,v->myenum);
  encode<testgen::_bigrecord_Union__0__>(e,&v->myunion);
  encode<testgen::_bigrecord_Union__1__>(e,&v->anotherunion);
  (**(code **)(*(long *)e + 0x28))(e,v->mybool);
  (**(code **)(*(long *)e + 0x48))((v->anothernested).inval1,e);
  (**(code **)(*(long *)e + 0x50))(e,&(v->anothernested).inval2);
  (**(code **)(*(long *)e + 0x30))(e,(v->anothernested).inval3);
  (**(code **)(*(long *)e + 0x60))(e,&v->myfixed,0x10);
  (**(code **)(*(long *)e + 0x30))(e,v->anotherint);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  puVar1 = (v->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar1) {
    puVar1 = (pointer)((long)&uStack_18 + 7);
  }
  (**(code **)(*(long *)e + 0x58))(e,puVar1);
  return;
}

Assistant:

static void encode(Encoder& e, const testgen::RootRecord& v) {
        avro::encode(e, v.mylong);
        avro::encode(e, v.nestedrecord);
        avro::encode(e, v.mymap);
        avro::encode(e, v.recordmap);
        avro::encode(e, v.myarray);
        avro::encode(e, v.myenum);
        avro::encode(e, v.myunion);
        avro::encode(e, v.anotherunion);
        avro::encode(e, v.mybool);
        avro::encode(e, v.anothernested);
        avro::encode(e, v.myfixed);
        avro::encode(e, v.anotherint);
        avro::encode(e, v.bytes);
    }